

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void write_velocity(char *fn,qnode_ptr_t p)

{
  int iVar1;
  param512_t *papVar2;
  int iVar3;
  long lVar4;
  int extraout_EDX;
  int iVar5;
  int iVar6;
  int *piVar7;
  qnode_ptr_t q;
  qnode_ptr_t q_00;
  int iVar8;
  long lVar9;
  int y_00;
  float fVar10;
  double dVar11;
  double dVar12;
  float y;
  float x;
  int iStack_a0;
  int local_3c;
  float local_38;
  float local_34;
  
  q = (qnode_ptr_t)0x180;
  iVar3 = creat(fn,0x180);
  if (iVar3 < 1) {
    write_velocity_cold_1();
    iVar3 = q->ofst;
    iVar5 = q->sizy - iVar3;
    q_00 = q;
    iVar6 = iVar3;
    if (iVar3 < iVar5) {
      do {
        for (; iVar3 < q->sizx - q->ofst; iVar3 = iVar3 + 1) {
          if (0 < q->sizz) {
            lVar9 = 0;
            do {
              fVar10 = dx((qnode_ptr_t)fn,q,iVar6,iVar3,(int)lVar9);
              (*q->param_ptr[lVar9])[q->res * iVar6 + iVar3].fx = fVar10;
              q_00 = q;
              fVar10 = dy((qnode_ptr_t)fn,q,iVar6,iVar3,(int)lVar9);
              (*q->param_ptr[lVar9])[q->res * iVar6 + iVar3].fy = fVar10;
              lVar9 = lVar9 + 1;
            } while (lVar9 < q->sizz);
          }
        }
        iVar6 = iVar6 + 1;
        iVar3 = q->ofst;
        iVar5 = q->sizy - iVar3;
      } while (iVar6 < iVar5);
    }
    iVar6 = ((qnode_ptr_t)fn)->sizz / 2;
    if (iVar3 < iVar5) {
      iVar1 = q->sizx;
      iStack_a0 = iVar3;
      do {
        if (iVar3 < iVar1 - iVar3) {
          piVar7 = &(*q->param_ptr[iVar6])[(long)iStack_a0 * (long)q->res + (long)iVar3].err;
          iVar8 = iVar1 + iVar3 * -2;
          y_00 = iVar3;
          do {
            if (*piVar7 == 0) {
              fVar10 = dt((qnode_ptr_t)fn,q_00,iStack_a0,y_00);
              piVar7[-4] = (int)fVar10;
            }
            y_00 = y_00 + 1;
            piVar7 = piVar7 + 8;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        iStack_a0 = iStack_a0 + 1;
      } while (iStack_a0 != iVar5);
    }
    if ((extraout_EDX == 0) && (iVar5 = q->ofst, iVar3 < q->sizy - iVar5)) {
      do {
        if (iVar5 < q->sizx - q->ofst) {
          lVar4 = (long)iVar5;
          lVar9 = (long)iVar3;
          do {
            if ((*q->param_ptr[iVar6])[q->res * lVar9 + lVar4].err == 0) {
              iVar5 = (int)lVar4;
              fVar10 = dxx(q,iVar3,iVar5,iVar6);
              (*q->param_ptr[iVar6])[q->res * lVar9 + lVar4].fxx = fVar10;
              fVar10 = dyy(q,iVar3,iVar5,iVar6);
              (*q->param_ptr[iVar6])[q->res * lVar9 + lVar4].fyy = fVar10;
              fVar10 = dxy(q,iVar3,iVar5,iVar6);
              (*q->param_ptr[iVar6])[q->res * lVar9 + lVar4].fxy = fVar10;
            }
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 < q->sizx - q->ofst);
        }
        iVar3 = iVar3 + 1;
        iVar5 = q->ofst;
      } while (iVar3 < q->sizy - iVar5);
    }
    iVar3 = q->ofst;
    if (iVar3 < q->sizy - iVar3) {
      iVar5 = iVar3;
      do {
        if (iVar3 < q->sizx - q->ofst) {
          lVar9 = (long)iVar3;
          do {
            papVar2 = q->param_ptr[iVar6];
            lVar4 = (long)q->res * (long)iVar5 + lVar9;
            if ((*papVar2)[lVar4].err == 0) {
              dVar12 = (double)(*papVar2)[lVar4].fx;
              dVar11 = (double)(*papVar2)[lVar4].fy;
              dVar11 = dVar11 * dVar11 + dVar12 * dVar12;
              if (dVar11 < 0.0) {
                dVar11 = sqrt(dVar11);
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              (*q->param_ptr[iVar6])[(long)q->res * (long)iVar5 + lVar9].mag = (float)dVar11;
            }
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < q->sizx - q->ofst);
        }
        iVar5 = iVar5 + 1;
        iVar3 = q->ofst;
      } while (iVar5 < q->sizy - iVar3);
    }
    return;
  }
  local_34 = (float)p->sizx;
  local_38 = (float)p->sizy;
  write(iVar3,&local_34,4);
  write(iVar3,&local_38,4);
  local_34 = (float)(p->sizx + KERNEL_X * -2 + -0x12);
  local_38 = (float)(p->sizy + KERNEL_Y * -2 + -0x12);
  write(iVar3,&local_34,4);
  write(iVar3,&local_38,4);
  local_34 = (float)(KERNEL_X + 9);
  local_38 = (float)(KERNEL_Y + 9);
  write(iVar3,&local_34,4);
  write(iVar3,&local_38,4);
  local_3c = KERNEL_Y + 9;
  if (local_3c < (p->sizy - KERNEL_Y) + -9) {
    do {
      if (KERNEL_X + 9 < (p->sizx - KERNEL_X) + -9) {
        lVar9 = (long)KERNEL_X + 9;
        do {
          lVar4 = (long)p->res * (long)local_3c + lVar9;
          local_34 = (*p->flow_ptr)[lVar4].y;
          local_38 = -(*p->flow_ptr)[lVar4].x;
          write(iVar3,&local_34,4);
          write(iVar3,&local_38,4);
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 < (p->sizx - KERNEL_X) + -9);
      }
      local_3c = local_3c + 1;
    } while (local_3c < (p->sizy - KERNEL_Y) + -9);
  }
  close(iVar3);
  return;
}

Assistant:

void write_velocity(fn,p)
qnode_ptr_t p ;
char *fn ;

{ extern int KERNEL_X, KERNEL_Y ;
  float x, y ;
  int i, j, fdf, bytes ;

  if ((fdf=creat(fn,0600)) < 1) {
    error(6) ;
  }

  x = p->sizx ;
  y = p->sizy ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;

  x = ((p->sizx-KERNEL_X-NRADIUS)-(KERNEL_X+NRADIUS)+SKIP-1)/SKIP ;
  y = ((p->sizy-KERNEL_Y-NRADIUS)-(KERNEL_Y+NRADIUS)+SKIP-1)/SKIP ;
  write(fdf,&x,4);
  write(fdf,&y,4);

  x = (KERNEL_X+NRADIUS+SKIP-1)/SKIP ;
  y = (KERNEL_Y+NRADIUS+SKIP-1)/SKIP ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;
  bytes = 24 ;

  for(i = KERNEL_Y + NRADIUS ; i < p->sizy - KERNEL_Y - NRADIUS ; i++) {
    for(j = KERNEL_X + NRADIUS ; j < p->sizx - KERNEL_X - NRADIUS ; j++) {
      x = (*p->flow_ptr)[p->res*i + j].y ;
      y = -(*p->flow_ptr)[p->res*i + j].x ;
      write(fdf,&x,4) ;
      write(fdf,&y,4) ;
      bytes += 8 ;
    }
  }
  close(fdf) ;
}